

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O2

bool __thiscall gimage::PNMImageIO::handlesFile(PNMImageIO *this,char *name,bool reading)

{
  long lVar1;
  bool bVar2;
  allocator local_31;
  string s;
  
  std::__cxx11::string::string((string *)&s,name,&local_31);
  if (s._M_string_length < 5) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f68d);
    bVar2 = true;
    if (lVar1 != s._M_string_length - 4) {
      lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f5c8);
      if (lVar1 != s._M_string_length - 4) {
        lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f557);
        if (lVar1 != s._M_string_length - 4) {
          lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f5cd);
          if (lVar1 != s._M_string_length - 4) {
            lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f5d2);
            if (lVar1 != s._M_string_length - 4) {
              lVar1 = std::__cxx11::string::rfind((char *)&s,0x14f5d7);
              bVar2 = lVar1 == s._M_string_length - 4;
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&s);
  return bVar2;
}

Assistant:

bool PNMImageIO::handlesFile(const char *name, bool reading) const
{
  std::string s=name;

  if (s.size() <= 4)
  {
    return false;
  }

  if (s.rfind(".pgm") == s.size()-4 || s.rfind(".PGM") == s.size()-4 ||
      s.rfind(".ppm") == s.size()-4 || s.rfind(".PPM") == s.size()-4 ||
      s.rfind(".pfm") == s.size()-4 || s.rfind(".PFM") == s.size()-4)
  {
    return true;
  }

  return false;
}